

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

void handle_pp_include(Context_conflict1 *ctx)

{
  char *pcVar1;
  IncludeState *pIVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  MOJOSHADER_includeClose close_callback;
  code *pcVar6;
  long lVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  char *__dest;
  bool bVar11;
  undefined8 uStack_60;
  char acStack_58 [7];
  bool local_51;
  MOJOSHADER_includeClose local_50;
  MOJOSHADER_includeClose callback;
  char *pcStack_40;
  uint newbytes;
  char *newdata;
  char local_2d;
  uint len;
  char ch;
  char *pcStack_28;
  int bogus;
  char *filename;
  MOJOSHADER_includeType incltype;
  Token token;
  IncludeState *state;
  Context_conflict1 *ctx_local;
  
  __dest = acStack_58;
  _incltype = ctx->include_stack;
  uStack_60 = 0x13e154;
  state = (IncludeState *)ctx;
  filename._4_4_ = lexer(_incltype);
  pcStack_28 = (char *)0x0;
  len = 0;
  if (filename._4_4_ == TOKEN_STRING_LITERAL) {
    filename._0_4_ = 0;
  }
  else if (filename._4_4_ == 0x3c) {
    filename._0_4_ = 1;
    do {
      do {
        do {
          if (len != 0) goto LAB_0013e22e;
          bVar11 = _incltype->bytes_left == 0;
          len = (uint)bVar11;
        } while (bVar11);
        local_2d = *_incltype->source;
        local_51 = local_2d == '\r' || local_2d == '\n';
        len = (uint)local_51;
      } while (local_2d == '\r' || local_2d == '\n');
      _incltype->source = _incltype->source + 1;
      _incltype->bytes_left = _incltype->bytes_left - 1;
    } while (local_2d != '>');
  }
  else {
    len = 1;
  }
LAB_0013e22e:
  if (len == 0) {
    _incltype->token = _incltype->token + 1;
    newdata._4_4_ = *(int *)&_incltype->source - *(int *)&_incltype->token;
    lVar7 = -((ulong)newdata._4_4_ + 0xf & 0xfffffffffffffff0);
    __dest = acStack_58 + lVar7;
    pcVar1 = _incltype->token;
    uVar9 = newdata._4_4_ - 1;
    pcStack_28 = __dest;
    *(undefined8 *)((long)&uStack_60 + lVar7) = 0x13e287;
    memcpy(__dest,pcVar1,(ulong)uVar9);
    pIVar2 = _incltype;
    pcStack_28[newdata._4_4_ - 1] = '\0';
    *(undefined8 *)((long)&uStack_60 + lVar7) = 0x13e2a0;
    iVar10 = require_newline(pIVar2);
    len = (uint)((iVar10 != 0 ^ 0xffU) & 1);
  }
  pIVar2 = state;
  uVar8 = filename._0_4_;
  pcVar1 = pcStack_28;
  if (len == 0) {
    pcStack_40 = (char *)0x0;
    callback._4_4_ = 0;
    if ((state[0x16].next == (IncludeState *)0x0) || (state[0x17].filename == (char *)0x0)) {
      __dest[-8] = '\x06';
      __dest[-7] = -0x1d;
      __dest[-6] = '\x13';
      __dest[-5] = '\0';
      __dest[-4] = '\0';
      __dest[-3] = '\0';
      __dest[-2] = '\0';
      __dest[-1] = '\0';
      fail((Context_conflict1 *)pIVar2,"Saw #include, but no include callbacks defined");
    }
    else {
      pIVar2 = state[0x16].next;
      pcVar3 = _incltype->source_base;
      pcVar4 = state[0x17].source_base;
      pcVar5 = state[0x17].token;
      *(char **)(__dest + -0x10) = state[0x17].source;
      *(char **)(__dest + -8) = pcVar5;
      __dest[-0x18] = ']';
      __dest[-0x17] = -0x1d;
      __dest[-0x16] = '\x13';
      __dest[-0x15] = '\0';
      __dest[-0x14] = '\0';
      __dest[-0x13] = '\0';
      __dest[-0x12] = '\0';
      __dest[-0x11] = '\0';
      iVar10 = (*(code *)pIVar2)(uVar8,pcVar1,pcVar3,&stack0xffffffffffffffc0,(long)&callback + 4,
                                 pcVar4);
      pIVar2 = state;
      pcVar3 = pcStack_28;
      pcVar1 = pcStack_40;
      uVar9 = callback._4_4_;
      if (iVar10 == 0) {
        __dest[-8] = 'v';
        __dest[-7] = -0x1d;
        __dest[-6] = '\x13';
        __dest[-5] = '\0';
        __dest[-4] = '\0';
        __dest[-3] = '\0';
        __dest[-2] = '\0';
        __dest[-1] = '\0';
        fail((Context_conflict1 *)pIVar2,"Include callback failed");
      }
      else {
        close_callback = (MOJOSHADER_includeClose)state[0x17].filename;
        local_50 = close_callback;
        __dest[-8] = -0x58;
        __dest[-7] = -0x1d;
        __dest[-6] = '\x13';
        __dest[-5] = '\0';
        __dest[-4] = '\0';
        __dest[-3] = '\0';
        __dest[-2] = '\0';
        __dest[-1] = '\0';
        iVar10 = push_source((Context_conflict1 *)pIVar2,pcVar3,pcVar1,uVar9,1,close_callback);
        pcVar1 = pcStack_40;
        if (iVar10 == 0) {
          if (*(int *)((long)&state->filename + 4) == 0) {
            __dest[-8] = -0x28;
            __dest[-7] = -0x1d;
            __dest[-6] = '\x13';
            __dest[-5] = '\0';
            __dest[-4] = '\0';
            __dest[-3] = '\0';
            __dest[-2] = '\0';
            __dest[-1] = '\0';
            __assert_fail("ctx->out_of_memory",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x33e,"void handle_pp_include(Context *)");
          }
          pcVar6 = (code *)state[0x17].filename;
          pcVar3 = state[0x17].source_base;
          pcVar4 = state[0x17].source;
          pcVar5 = state[0x17].token;
          __dest[-8] = '\n';
          __dest[-7] = -0x1c;
          __dest[-6] = '\x13';
          __dest[-5] = '\0';
          __dest[-4] = '\0';
          __dest[-3] = '\0';
          __dest[-2] = '\0';
          __dest[-1] = '\0';
          (*pcVar6)(pcVar1,pcVar3,pcVar4,pcVar5);
        }
      }
    }
  }
  else {
    __dest[-8] = -0x3a;
    __dest[-7] = -0x1e;
    __dest[-6] = '\x13';
    __dest[-5] = '\0';
    __dest[-4] = '\0';
    __dest[-3] = '\0';
    __dest[-2] = '\0';
    __dest[-1] = '\0';
    fail((Context_conflict1 *)pIVar2,"Invalid #include directive");
  }
  return;
}

Assistant:

static void handle_pp_include(Context *ctx)
{
    IncludeState *state = ctx->include_stack;
    Token token = lexer(state);
    MOJOSHADER_includeType incltype;
    char *filename = NULL;
    int bogus = 0;

    if (token == TOKEN_STRING_LITERAL)
        incltype = MOJOSHADER_INCLUDETYPE_LOCAL;
    else if (token == ((Token) '<'))
    {
        incltype = MOJOSHADER_INCLUDETYPE_SYSTEM;
        // can't use lexer, since every byte between the < > pair is
        //  considered part of the filename.  :/
        while (!bogus)
        {
            if ( !(bogus = (state->bytes_left == 0)) )
            {
                const char ch = *state->source;
                if ( !(bogus = ((ch == '\r') || (ch == '\n'))) )
                {
                    state->source++;
                    state->bytes_left--;

                    if (ch == '>')
                        break;
                } // if
            } // if
        } // while
    } // else if
    else
    {
        bogus = 1;
    } // else

    if (!bogus)
    {
        state->token++;  // skip '<' or '\"'...
        const unsigned int len = ((unsigned int) (state->source-state->token));
        filename = (char *) alloca(len);
        memcpy(filename, state->token, len-1);
        filename[len-1] = '\0';
        bogus = !require_newline(state);
    } // if

    if (bogus)
    {
        fail(ctx, "Invalid #include directive");
        return;
    } // else

    const char *newdata = NULL;
    unsigned int newbytes = 0;
    if ((ctx->open_callback == NULL) || (ctx->close_callback == NULL))
    {
        fail(ctx, "Saw #include, but no include callbacks defined");
        return;
    } // if

    if (!ctx->open_callback(incltype, filename, state->source_base,
                            &newdata, &newbytes, ctx->malloc,
                            ctx->free, ctx->malloc_data))
    {
        fail(ctx, "Include callback failed");  // !!! FIXME: better error
        return;
    } // if

    MOJOSHADER_includeClose callback = ctx->close_callback;
    if (!push_source(ctx, filename, newdata, newbytes, 1, callback))
    {
        assert(ctx->out_of_memory);
        ctx->close_callback(newdata, ctx->malloc, ctx->free, ctx->malloc_data);
    } // if
}